

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request_body.c
# Opt level: O0

ngx_int_t ngx_http_do_read_client_request_body(ngx_http_request_t *r)

{
  ngx_connection_t *pnVar1;
  ngx_http_request_body_t *pnVar2;
  long lVar3;
  ngx_int_t nVar4;
  ssize_t sVar5;
  ngx_http_core_loc_conf_t *clcf;
  ngx_http_request_body_t *rb;
  ngx_connection_t *c;
  ngx_chain_t out;
  ngx_int_t rc;
  ssize_t n;
  size_t size;
  off_t rest;
  ngx_http_request_t *r_local;
  
  pnVar1 = r->connection;
  pnVar2 = r->request_body;
  if ((pnVar1->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pnVar1->log,0,"http read client request body");
  }
LAB_00173ecf:
  do {
    if (pnVar2->buf->last == pnVar2->buf->end) {
      if (pnVar2->buf->pos == pnVar2->buf->last) {
        lVar3 = ngx_http_request_body_filter(r,(ngx_chain_t *)0x0);
      }
      else {
        c = (ngx_connection_t *)pnVar2->buf;
        out.buf = (ngx_buf_t *)0x0;
        lVar3 = ngx_http_request_body_filter(r,(ngx_chain_t *)&c);
      }
      if (lVar3 != 0) {
        return lVar3;
      }
      out.next = (ngx_chain_t *)0x0;
      if (pnVar2->busy != (ngx_chain_t *)0x0) {
        if ((*(ulong *)&r->field_0x460 >> 0x3a & 1) == 0) {
          return 500;
        }
        if ((*(uint *)&pnVar1->read->field_0x8 >> 0xb & 1) != 0) {
          ngx_event_del_timer(pnVar1->read);
        }
        nVar4 = ngx_handle_read_event(pnVar1->read,0);
        if (nVar4 != 0) {
          return 500;
        }
        return -2;
      }
      pnVar2->buf->pos = pnVar2->buf->start;
      pnVar2->buf->last = pnVar2->buf->start;
    }
    n = (long)pnVar2->buf->end - (long)pnVar2->buf->last;
    lVar3 = pnVar2->rest - ((long)pnVar2->buf->last - (long)pnVar2->buf->pos);
    if (lVar3 < n) {
      n = lVar3;
    }
    sVar5 = (*pnVar1->recv)(pnVar1,pnVar2->buf->last,n);
    if ((pnVar1->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar1->log,0,"http client request body recv %z",sVar5);
    }
    if (sVar5 != -2) {
      if ((sVar5 == 0) && (6 < pnVar1->log->log_level)) {
        ngx_log_error_core(7,pnVar1->log,0,"client prematurely closed connection");
      }
      if ((sVar5 == 0) || (sVar5 == -1)) {
        *(uint *)&pnVar1->field_0xd8 = *(uint *)&pnVar1->field_0xd8 & 0xffffefff | 0x1000;
        return 400;
      }
      pnVar2->buf->last = pnVar2->buf->last + sVar5;
      r->request_length = sVar5 + r->request_length;
      if (sVar5 == lVar3) {
        c = (ngx_connection_t *)pnVar2->buf;
        out.buf = (ngx_buf_t *)0x0;
        nVar4 = ngx_http_request_body_filter(r,(ngx_chain_t *)&c);
        if (nVar4 != 0) {
          return nVar4;
        }
        out.next = (ngx_chain_t *)0x0;
      }
      if ((pnVar2->rest != 0) && (pnVar2->buf->end <= pnVar2->buf->last)) goto LAB_00173ecf;
    }
    if ((pnVar1->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar1->log,0,"http client request body rest %O",pnVar2->rest);
    }
    if (pnVar2->rest == 0) {
      if ((*(uint *)&pnVar1->read->field_0x8 >> 0xb & 1) != 0) {
        ngx_event_del_timer(pnVar1->read);
      }
      if ((*(ulong *)&r->field_0x460 >> 0x3a & 1) == 0) {
        r->read_event_handler = ngx_http_block_reading;
        (*pnVar2->post_handler)(r);
      }
      return 0;
    }
    if ((*(uint *)&pnVar1->read->field_0x8 >> 5 & 1) == 0) {
      if (((*(ulong *)&r->field_0x460 >> 0x3a & 1) != 0) && (pnVar2->buf->pos != pnVar2->buf->last))
      {
        c = (ngx_connection_t *)pnVar2->buf;
        out.buf = (ngx_buf_t *)0x0;
        nVar4 = ngx_http_request_body_filter(r,(ngx_chain_t *)&c);
        if (nVar4 != 0) {
          return nVar4;
        }
        out.next = (ngx_chain_t *)0x0;
      }
      ngx_event_add_timer(pnVar1->read,
                          *(ngx_msec_t *)((long)r->loc_conf[ngx_http_core_module.ctx_index] + 0x100)
                         );
      nVar4 = ngx_handle_read_event(pnVar1->read,0);
      if (nVar4 == 0) {
        r_local = (ngx_http_request_t *)0xfffffffffffffffe;
      }
      else {
        r_local = (ngx_http_request_t *)0x1f4;
      }
      return (ngx_int_t)r_local;
    }
  } while( true );
}

Assistant:

static ngx_int_t
ngx_http_do_read_client_request_body(ngx_http_request_t *r)
{
    off_t                      rest;
    size_t                     size;
    ssize_t                    n;
    ngx_int_t                  rc;
    ngx_chain_t                out;
    ngx_connection_t          *c;
    ngx_http_request_body_t   *rb;
    ngx_http_core_loc_conf_t  *clcf;

    c = r->connection;
    rb = r->request_body;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, c->log, 0,
                   "http read client request body");

    for ( ;; ) {
        for ( ;; ) {
            if (rb->buf->last == rb->buf->end) {

                if (rb->buf->pos != rb->buf->last) {

                    /* pass buffer to request body filter chain */

                    out.buf = rb->buf;
                    out.next = NULL;

                    rc = ngx_http_request_body_filter(r, &out);

                    if (rc != NGX_OK) {
                        return rc;
                    }

                } else {

                    /* update chains */

                    rc = ngx_http_request_body_filter(r, NULL);

                    if (rc != NGX_OK) {
                        return rc;
                    }
                }

                if (rb->busy != NULL) {
                    if (r->request_body_no_buffering) {
                        if (c->read->timer_set) {
                            ngx_del_timer(c->read);
                        }

                        if (ngx_handle_read_event(c->read, 0) != NGX_OK) {
                            return NGX_HTTP_INTERNAL_SERVER_ERROR;
                        }

                        return NGX_AGAIN;
                    }

                    return NGX_HTTP_INTERNAL_SERVER_ERROR;
                }

                rb->buf->pos = rb->buf->start;
                rb->buf->last = rb->buf->start;
            }

            size = rb->buf->end - rb->buf->last;
            rest = rb->rest - (rb->buf->last - rb->buf->pos);

            if ((off_t) size > rest) {
                size = (size_t) rest;
            }

            n = c->recv(c, rb->buf->last, size);

            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, c->log, 0,
                           "http client request body recv %z", n);

            if (n == NGX_AGAIN) {
                break;
            }

            if (n == 0) {
                ngx_log_error(NGX_LOG_INFO, c->log, 0,
                              "client prematurely closed connection");
            }

            if (n == 0 || n == NGX_ERROR) {
                c->error = 1;
                return NGX_HTTP_BAD_REQUEST;
            }

            rb->buf->last += n;
            r->request_length += n;

            if (n == rest) {
                /* pass buffer to request body filter chain */

                out.buf = rb->buf;
                out.next = NULL;

                rc = ngx_http_request_body_filter(r, &out);

                if (rc != NGX_OK) {
                    return rc;
                }
            }

            if (rb->rest == 0) {
                break;
            }

            if (rb->buf->last < rb->buf->end) {
                break;
            }
        }

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, c->log, 0,
                       "http client request body rest %O", rb->rest);

        if (rb->rest == 0) {
            break;
        }

        if (!c->read->ready) {

            if (r->request_body_no_buffering
                && rb->buf->pos != rb->buf->last)
            {
                /* pass buffer to request body filter chain */

                out.buf = rb->buf;
                out.next = NULL;

                rc = ngx_http_request_body_filter(r, &out);

                if (rc != NGX_OK) {
                    return rc;
                }
            }

            clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);
            ngx_add_timer(c->read, clcf->client_body_timeout);

            if (ngx_handle_read_event(c->read, 0) != NGX_OK) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            return NGX_AGAIN;
        }
    }

    if (c->read->timer_set) {
        ngx_del_timer(c->read);
    }

    if (!r->request_body_no_buffering) {
        r->read_event_handler = ngx_http_block_reading;
        rb->post_handler(r);
    }

    return NGX_OK;
}